

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O1

void __thiscall
Js::DynamicObject::ReplaceTypeWithPredecessorType(DynamicObject *this,DynamicType *predecessorType)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  Type *addr;
  
  iVar3 = (**(code **)(**(long **)((this->super_RecyclableObject).type.ptr + 1) + 0x270))();
  if (iVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x178,"(this->GetTypeHandler()->IsPathTypeHandler())",
                                "this->GetTypeHandler()->IsPathTypeHandler()");
    if (!bVar2) goto LAB_00dbee48;
    *puVar4 = 0;
  }
  addr = &(this->super_RecyclableObject).type;
  iVar3 = (**(code **)(**(long **)(*(long *)(*(long *)(addr->ptr + 1) + 0x18) + 0x28) + 0x270))();
  if (iVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x179,
                                "(((PathTypeHandlerBase*)this->GetTypeHandler())->GetPredecessorType()->GetTypeHandler()->IsPathTypeHandler())"
                                ,
                                "((PathTypeHandlerBase*)this->GetTypeHandler())->GetPredecessorType()->GetTypeHandler()->IsPathTypeHandler()"
                               );
    if (!bVar2) goto LAB_00dbee48;
    *puVar4 = 0;
  }
  if (*(DynamicType **)(*(long *)(addr->ptr + 1) + 0x18) != predecessorType) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x17b,
                                "(((PathTypeHandlerBase*)this->GetTypeHandler())->GetPredecessorType() == predecessorType)"
                                ,
                                "((PathTypeHandlerBase*)this->GetTypeHandler())->GetPredecessorType() == predecessorType"
                               );
    if (!bVar2) goto LAB_00dbee48;
    *puVar4 = 0;
  }
  if ((predecessorType->isLocked == true) &&
     ((((predecessorType->typeHandler).ptr)->flags & 4) == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x17d,
                                "(!predecessorType->GetIsLocked() || predecessorType->GetTypeHandler()->GetIsLocked())"
                                ,
                                "!predecessorType->GetIsLocked() || predecessorType->GetTypeHandler()->GetIsLocked()"
                               );
    if (!bVar2) goto LAB_00dbee48;
    *puVar4 = 0;
  }
  if ((predecessorType->isShared == true) &&
     ((((predecessorType->typeHandler).ptr)->flags & 0x10) == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x17e,
                                "(!predecessorType->GetIsShared() || predecessorType->GetTypeHandler()->GetIsShared())"
                                ,
                                "!predecessorType->GetIsShared() || predecessorType->GetTypeHandler()->GetIsShared()"
                               );
    if (!bVar2) goto LAB_00dbee48;
    *puVar4 = 0;
  }
  if ((addr->ptr->prototype).ptr != (predecessorType->super_Type).prototype.ptr) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x180,
                                "(this->GetType()->GetPrototype() == predecessorType->GetPrototype())"
                                ,
                                "this->GetType()->GetPrototype() == predecessorType->GetPrototype()"
                               );
    if (!bVar2) goto LAB_00dbee48;
    *puVar4 = 0;
  }
  if (((predecessorType->typeHandler).ptr)->inlineSlotCapacity <
      *(ushort *)(*(long *)(addr->ptr + 1) + 0x12)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x185,
                                "(predecessorPathTypeHandler->GetInlineSlotCapacity() >= currentPathTypeHandler->GetInlineSlotCapacity())"
                                ,
                                "predecessorPathTypeHandler->GetInlineSlotCapacity() >= currentPathTypeHandler->GetInlineSlotCapacity()"
                               );
    if (!bVar2) {
LAB_00dbee48:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = &predecessorType->super_Type;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  return;
}

Assistant:

void DynamicObject::ReplaceTypeWithPredecessorType(DynamicType * predecessorType)
    {
        Assert(this->GetTypeHandler()->IsPathTypeHandler());
        Assert(((PathTypeHandlerBase*)this->GetTypeHandler())->GetPredecessorType()->GetTypeHandler()->IsPathTypeHandler());

        Assert(((PathTypeHandlerBase*)this->GetTypeHandler())->GetPredecessorType() == predecessorType);

        Assert(!predecessorType->GetIsLocked() || predecessorType->GetTypeHandler()->GetIsLocked());
        Assert(!predecessorType->GetIsShared() || predecessorType->GetTypeHandler()->GetIsShared());

        Assert(this->GetType()->GetPrototype() == predecessorType->GetPrototype());

        PathTypeHandlerBase* currentPathTypeHandler = (PathTypeHandlerBase*)this->GetTypeHandler();
        PathTypeHandlerBase* predecessorPathTypeHandler = (PathTypeHandlerBase*)predecessorType->GetTypeHandler();

        Assert(predecessorPathTypeHandler->GetInlineSlotCapacity() >= currentPathTypeHandler->GetInlineSlotCapacity());

        this->type = predecessorType;
    }